

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O0

tdir_t TIFFNumberOfDirectories(TIFF *tif)

{
  int iVar1;
  bool bVar2;
  tdir_t local_20;
  tdir_t local_1c;
  tdir_t n;
  tdir_t nextdirnum;
  uint64_t nextdiroff;
  TIFF *tif_local;
  
  if ((tif->tif_flags & 0x80000) == 0) {
    _n = (ulong)(tif->tif_header).classic.tiff_diroff;
  }
  else {
    _n = (tif->tif_header).big.tiff_diroff;
  }
  local_1c = 0;
  local_20 = 0;
  nextdiroff = (uint64_t)tif;
  while( true ) {
    bVar2 = false;
    if (_n != 0) {
      iVar1 = TIFFAdvanceDirectory((TIFF *)nextdiroff,(uint64_t *)&n,(uint64_t *)0x0,&local_1c);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

tdir_t TIFFNumberOfDirectories(TIFF *tif)
{
    uint64_t nextdiroff;
    tdir_t nextdirnum;
    tdir_t n;
    if (!(tif->tif_flags & TIFF_BIGTIFF))
        nextdiroff = tif->tif_header.classic.tiff_diroff;
    else
        nextdiroff = tif->tif_header.big.tiff_diroff;
    nextdirnum = 0;
    n = 0;
    while (nextdiroff != 0 &&
           TIFFAdvanceDirectory(tif, &nextdiroff, NULL, &nextdirnum))
    {
        ++n;
    }
    return (n);
}